

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTypeID lj_ctype_intern(CTState *cts,CTInfo info,CTSize size)

{
  CType *pCVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint unaff_R15D;
  
  uVar3 = (size ^ info) - (size << 0xe | size >> 0x12);
  uVar4 = (size >> 0xd ^ uVar3) - (uVar3 >> 0x13) & 0x7f;
  uVar3 = (uint)cts->hash[uVar4];
  do {
    if (uVar3 == 0) {
      uVar3 = cts->top;
      if (cts->sizetab <= uVar3) {
        lj_ctype_intern_cold_1();
      }
      cts->top = uVar3 + 1;
      pCVar1 = cts->tab;
      pCVar1[uVar3].info = info;
      pCVar1[uVar3].size = size;
      pCVar1[uVar3].sib = 0;
      pCVar1[uVar3].next = cts->hash[uVar4];
      pCVar1[uVar3].name.gcptr32 = 0;
      cts->hash[uVar4] = (CTypeID1)uVar3;
      return uVar3;
    }
    pCVar1 = cts->tab;
    if ((pCVar1[uVar3].info == info) && (pCVar1[uVar3].size == size)) {
      bVar2 = false;
      unaff_R15D = uVar3;
    }
    else {
      uVar3 = (uint)pCVar1[uVar3].next;
      bVar2 = true;
    }
  } while (bVar2);
  return unaff_R15D;
}

Assistant:

CTypeID lj_ctype_intern(CTState *cts, CTInfo info, CTSize size)
{
  uint32_t h = ct_hashtype(info, size);
  CTypeID id = cts->hash[h];
  lua_assert(cts->L);
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (ct->info == info && ct->size == size)
      return id;
    id = ct->next;
  }
  id = cts->top;
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
  }
  cts->top = id+1;
  cts->tab[id].info = info;
  cts->tab[id].size = size;
  cts->tab[id].sib = 0;
  cts->tab[id].next = cts->hash[h];
  setgcrefnull(cts->tab[id].name);
  cts->hash[h] = (CTypeID1)id;
  return id;
}